

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O1

void IOcontroller::write_order_seeds
               (string *outFileName,TResult *resultObj,string *outFolder,Graph *graph)

{
  pointer pcVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outpath;
  Nodelist vecSeed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream outFile;
  long *local_2b0;
  long local_2a8;
  long local_2a0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_290;
  long *local_278 [2];
  long local_268 [2];
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  Graph *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_238 = graph;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_290,&resultObj->__VecSeed)
  ;
  mkdir((outFolder->_M_dataplus)._M_p,0x1db);
  local_2b0 = local_2a0;
  pcVar1 = (outFolder->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar1,pcVar1 + outFolder->_M_string_length);
  std::__cxx11::string::append((char *)&local_2b0);
  mkdir((char *)local_2b0,0x1db);
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,local_2b0,(long)local_2b0 + local_2a8);
  std::__cxx11::string::append((char *)local_278);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_278,(ulong)(outFileName->_M_dataplus)._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_248 = *plVar4;
    lStack_240 = plVar2[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *plVar4;
    local_258 = (long *)*plVar2;
  }
  local_250 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::ofstream::ofstream(&local_230,(string *)&local_258,_S_out);
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if (local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      local_258 = (long *)CONCAT71(local_258._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_258,1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_290.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_290.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  if (local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void write_order_seeds(const std::string& outFileName, const TResult& resultObj,
            const std::string& outFolder, const Graph & graph)
    {
        auto vecSeed = resultObj.get_seed_vec();
        mkdir_absence(outFolder.c_str());
        const auto outpath = outFolder + "/seed";
        mkdir_absence(outpath.c_str());
        std::ofstream outFile(outpath + "/seed_" + outFileName);
        for (auto i = 0; i < vecSeed.size(); i++)
        {
            outFile << vecSeed[i] << " " << graph[i].size() << '\n';
        }
        outFile.close();
    }